

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void __thiscall CProficiencies::CheckImprove(CProficiencies *this,int pindex,int chance)

{
  pointer ppVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  long *local_2c8 [2];
  long local_2b8 [2];
  char *local_2a8 [2];
  char *local_298;
  char *local_288;
  char *local_278;
  buffer<char> local_260;
  char local_240 [536];
  
  if (((0xfffffff6 < this->profs[pindex] - 10U) && (iVar2 = number_percent(), iVar2 < 0xb)) &&
     (iVar2 = number_percent(), iVar2 < 0xb)) {
    if ((4 < this->profs[pindex]) &&
       (iVar3 = number_percent(), iVar2 = this->profs[pindex] * 6,
       iVar3 != iVar2 && SBORROW4(iVar3,iVar2) == iVar3 + this->profs[pindex] * -6 < 0)) {
      return;
    }
    iVar2 = number_percent();
    if (iVar2 <= chance) {
      this->profs[pindex] = this->profs[pindex] + 1;
      pcVar4 = get_char_color(this->ch,"green");
      ppVar1 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar2 = this->profs[pindex];
      local_278 = END_COLOR(this->ch);
      local_298 = "improved at";
      if (iVar2 == 10) {
        local_298 = "mastered";
      }
      local_288 = ppVar1[pindex].name;
      local_260.size_ = 0;
      local_260._vptr_buffer = (_func_int **)&PTR_grow_00457340;
      local_260.capacity_ = 500;
      fmt.size_ = 0x15;
      fmt.data_ = "{}You have {} {}.{}\n\r";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_2a8;
      args.desc_ = 0xcccc;
      local_2a8[0] = pcVar4;
      local_260.ptr_ = local_240;
      ::fmt::v9::detail::vformat_to<char>(&local_260,fmt,args,(locale_ref)0x0);
      local_2c8[0] = local_2b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,local_260.ptr_,local_260.ptr_ + local_260.size_);
      if (local_260.ptr_ != local_240) {
        operator_delete(local_260.ptr_,local_260.capacity_);
      }
      send_to_char((char *)local_2c8[0],this->ch);
      gain_exp(this->ch,0xfa);
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0],local_2b8[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void CProficiencies::CheckImprove(int pindex, int chance) //chance is out of 10000
{
	if (profs[pindex] >= 10 || profs[pindex] < 1)
		return;

	if (number_percent() > 10)
		return;

	if (number_percent() > 10)
		return;

	if (profs[pindex] > 4)
	{
		if(number_percent() > (6 * profs[pindex]))
			return;
	}

	if (number_percent() > chance)
		return;

	profs[pindex]++;

	auto buffer = fmt::format("{}You have {} {}.{}\n\r", 
		get_char_color(ch, "green"), 
		profs[pindex] == 10 ? "mastered" : "improved at",
		prof_table[pindex].name, 
		END_COLOR(ch));
	send_to_char(buffer.c_str(), ch);

	gain_exp(ch, 250);
}